

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O2

string * gmlc::networking::getLocalExternalAddressV6_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  bool bVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  size_type sVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pointer __str;
  size_type *this;
  string local_188;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_158;
  long *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  size_type local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  resolver resolver;
  
  query.hints_._0_8_ = &query.hints_.ai_addrlen;
  query.hints_.ai_socktype = 0;
  query.hints_.ai_protocol = 0;
  query.hints_.ai_addrlen._0_1_ = 0;
  AsioContextManager::getContextPointer((AsioContextManager *)&srv,(string *)&query);
  std::__cxx11::string::~string((string *)&query);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&resolver,
             ((srv.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
  local_148 = (long *)CONCAT44(local_148._4_4_,10);
  asio::ip::host_name_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168,"",(allocator<char> *)&interface_addresses);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&query,(protocol_type *)&local_148,&local_188,(string *)local_168,address_configured);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)&local_188);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&local_188,&resolver,&query);
  local_138 = local_188.field_2._M_allocated_capacity;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length;
  this = &local_188._M_string_length;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity = 0;
  local_148 = (long *)local_188._M_dataplus._M_p;
  local_188._M_dataplus._M_p = (pointer)0x0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this);
  lVar3 = *local_148;
  lVar7 = local_138 * 0x60;
  local_168._4_4_ = *(undefined4 *)(lVar3 + 4 + lVar7);
  psVar2 = (size_type *)(lVar3 + 8 + lVar7);
  local_168._8_8_ = *psVar2;
  aStack_158._M_allocated_capacity = psVar2[1];
  local_168[0] = *(short *)(lVar3 + lVar7) != 2;
  if ((bool)local_168[0]) {
    aStack_158._8_4_ = *(undefined4 *)(lVar3 + 0x18 + lVar7);
    local_168._4_4_ = 0;
  }
  else {
    local_168._8_8_ = 0;
    aStack_158._M_allocated_capacity = 0;
    aStack_158._8_4_ = 0;
  }
  local_168._1_3_ = 0;
  asio::ip::address::to_string_abi_cxx11_(&local_188,(address *)local_168);
  netif::getInterfaceAddressesV6_abi_cxx11_();
  if (interface_addresses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      interface_addresses.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (interface_addresses.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       interface_addresses.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_188);
    if (_Var5._M_current ==
        interface_addresses.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_168._0_8_ = &aStack_158;
      local_168._8_8_ = 0;
      aStack_158._M_allocated_capacity = aStack_158._M_allocated_capacity & 0xffffffffffffff00;
      for (__str = interface_addresses.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __str != _Var5._M_current;
          __str = __str + 1) {
        std::__cxx11::string::string((string *)in_RDI,__str);
        bVar4 = std::operator==(in_RDI,"::1");
        if (!bVar4) {
          sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                        "fe80:",0);
          if (sVar6 != 0) goto LAB_0032cb98;
          if (local_168._8_8_ == 0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168
                      ,in_RDI);
          }
        }
        std::__cxx11::string::~string((string *)in_RDI);
      }
      paVar1 = &in_RDI->field_2;
      (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
      if (local_168._8_8_ == 0) {
        paVar8 = &local_188.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == paVar8) {
          paVar1->_M_allocated_capacity = local_188.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_188.field_2._8_8_;
        }
        else {
          (in_RDI->_M_dataplus)._M_p = local_188._M_dataplus._M_p;
          (in_RDI->field_2)._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
        }
        in_RDI->_M_string_length = local_188._M_string_length;
        local_188._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        paVar8 = &aStack_158;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ == paVar8) {
          paVar1->_M_allocated_capacity = aStack_158._M_allocated_capacity;
          *(ulong *)((long)&in_RDI->field_2 + 8) = CONCAT44(aStack_158._12_4_,aStack_158._8_4_);
        }
        else {
          (in_RDI->_M_dataplus)._M_p = (pointer)local_168._0_8_;
          (in_RDI->field_2)._M_allocated_capacity = aStack_158._M_allocated_capacity;
        }
        this = (size_type *)(local_168 + 8);
        in_RDI->_M_string_length = local_168._8_8_;
        local_168._0_8_ = paVar8;
      }
      *this = 0;
      paVar8->_M_local_buf[0] = '\0';
LAB_0032cb98:
      std::__cxx11::string::~string((string *)local_168);
      goto LAB_0032cba7;
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p == &local_188.field_2) {
    (in_RDI->field_2)._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_188.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = local_188._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
  }
  in_RDI->_M_string_length = local_188._M_string_length;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity =
       local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
LAB_0032cba7:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&interface_addresses);
  std::__cxx11::string::~string((string *)&local_188);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_140);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&resolver.impl_);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &srv.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (string *)in_RDI;
}

Assistant:

std::string getLocalExternalAddressV6()
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v6(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query);
    asio::ip::tcp::endpoint endpoint = *it;

    auto resolved_address = endpoint.address().to_string();
#else
    std::string resolved_address;
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV6();

    // Return the resolved address if no interface addresses were found
    if (interface_addresses.empty()) {
        return resolved_address;
    }

    // Use the resolved address if it matches one of the interface addresses
    if (std::find(
            interface_addresses.begin(),
            interface_addresses.end(),
            resolved_address) != interface_addresses.end()) {
        return resolved_address;
    }

    // Pick an interface that isn't the IPv6 loopback address, ::1/128
    // or an IPv6 link-local address, fe80::/16
    std::string link_local_addr;
    for (auto addr : interface_addresses) {
        if (addr != "::1") {
            if (addr.rfind("fe80:", 0) != 0) {
                return addr;
            }
            if (link_local_addr.empty()) {
                link_local_addr = addr;
            }
        }
    }

    // No other choices, so return a link local address if one was found
    if (!link_local_addr.empty()) {
        return link_local_addr;
    }

    // Very likely that any address returned at this point won't be a working
    // external address
    return resolved_address;
}